

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O0

size_t read_from_input(AvxInputContext *input_ctx,size_t n,uchar *buf)

{
  ulong __n;
  void *in_RDX;
  size_t in_RSI;
  long in_RDI;
  size_t read_n;
  size_t buffered_bytes;
  undefined8 local_28;
  
  __n = *(long *)(in_RDI + 0x40) - *(long *)(in_RDI + 0x48);
  if (__n == 0) {
    local_28 = fread(in_RDX,1,in_RSI,*(FILE **)(in_RDI + 8));
  }
  else if (__n < in_RSI) {
    memcpy(in_RDX,(void *)(in_RDI + 0x18 + *(long *)(in_RDI + 0x48)),__n);
    *(ulong *)(in_RDI + 0x48) = __n + *(long *)(in_RDI + 0x48);
    local_28 = fread((void *)((long)in_RDX + __n),1,in_RSI - __n,*(FILE **)(in_RDI + 8));
    local_28 = local_28 + __n;
  }
  else {
    memcpy(in_RDX,(void *)(in_RDI + 0x18 + *(long *)(in_RDI + 0x48)),in_RSI);
    *(size_t *)(in_RDI + 0x48) = in_RSI + *(long *)(in_RDI + 0x48);
    local_28 = in_RSI;
  }
  return local_28;
}

Assistant:

size_t read_from_input(struct AvxInputContext *input_ctx, size_t n,
                       unsigned char *buf) {
  const size_t buffered_bytes =
      input_ctx->detect.buf_read - input_ctx->detect.position;
  size_t read_n;
  if (buffered_bytes == 0) {
    read_n = fread(buf, 1, n, input_ctx->file);
  } else if (n <= buffered_bytes) {
    memcpy(buf, input_ctx->detect.buf + input_ctx->detect.position, n);
    input_ctx->detect.position += n;
    read_n = n;
  } else {
    memcpy(buf, input_ctx->detect.buf + input_ctx->detect.position,
           buffered_bytes);
    input_ctx->detect.position += buffered_bytes;
    read_n = buffered_bytes;
    read_n +=
        fread(buf + buffered_bytes, 1, n - buffered_bytes, input_ctx->file);
  }
  return read_n;
}